

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfg_structurizer.cpp
# Opt level: O2

bool __thiscall
dxil_spv::CFGStructurizer::control_flow_is_escaping
          (CFGStructurizer *this,CFGNode *node,CFGNode *merge)

{
  pointer ppCVar1;
  CFGNode *pCVar2;
  bool bVar3;
  pointer ppCVar4;
  byte bVar5;
  uint uVar6;
  CFGNode *other;
  
  if (node == merge) {
LAB_00130f5e:
    uVar6 = 0;
    goto LAB_00130f60;
  }
  bVar3 = control_flow_is_escaping_from_loop(this,node,merge);
  if (!bVar3) {
    bVar3 = block_is_load_bearing(this,node,merge);
    uVar6 = 0;
    if (bVar3) goto LAB_00130f60;
    for (ppCVar4 = (node->post_dominance_frontier).
                   super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        ppCVar4 !=
        (node->post_dominance_frontier).
        super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
        ._M_impl.super__Vector_impl_data._M_finish; ppCVar4 = ppCVar4 + 1) {
      uVar6 = uVar6 + (((*ppCVar4)->ir).terminator.type == Switch);
    }
    if (uVar6 < 2) {
      bVar3 = CFGNode::reaches_domination_frontier_before_merge(node,merge);
      if (bVar3) goto LAB_00130f5e;
      ppCVar1 = (node->post_dominance_frontier).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
      for (ppCVar4 = (node->post_dominance_frontier).
                     super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                     ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
          ppCVar4 = ppCVar4 + 1) {
        pCVar2 = *ppCVar4;
        bVar3 = CFGNode::dominates(pCVar2,node);
        if (bVar3) {
          bVar3 = CFGNode::reaches_domination_frontier_before_merge(pCVar2,merge);
          if (bVar3) goto LAB_00130f06;
        }
      }
      ppCVar4 = (node->succ).
                super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                ._M_impl.super__Vector_impl_data._M_start;
      if (((long)(node->succ).
                 super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                 ._M_impl.super__Vector_impl_data._M_finish - (long)ppCVar4 != 8) ||
         ((*ppCVar4)->succ_back_edge == (CFGNode *)0x0)) {
        if (((node->ir).operations.
             super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
             ._M_impl.super__Vector_impl_data._M_start ==
             (node->ir).operations.
             super__Vector_base<dxil_spv::Operation_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::Operation_*>_>
             ._M_impl.super__Vector_impl_data._M_finish) &&
           ((node->ir).phi.
            super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
            _M_impl.super__Vector_impl_data._M_start ==
            (node->ir).phi.
            super__Vector_base<dxil_spv::PHI,_dxil_spv::ThreadLocalAllocator<dxil_spv::PHI>_>.
            _M_impl.super__Vector_impl_data._M_finish)) {
          bVar3 = CFGNode::post_dominates_any_work(node);
          if (!bVar3) goto LAB_00130f06;
        }
        uVar6 = 1;
        if (8 < (ulong)((long)(node->pred).
                              super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                              ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(node->pred).
                             super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                             ._M_impl.super__Vector_impl_data._M_start)) {
          pCVar2 = node->immediate_dominator;
          ppCVar1 = (merge->pred).
                    super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                    ._M_impl.super__Vector_impl_data._M_finish;
          bVar5 = 0;
          for (ppCVar4 = (merge->pred).
                         super__Vector_base<dxil_spv::CFGNode_*,_dxil_spv::ThreadLocalAllocator<dxil_spv::CFGNode_*>_>
                         ._M_impl.super__Vector_impl_data._M_start; ppCVar4 != ppCVar1;
              ppCVar4 = ppCVar4 + 1) {
            other = *ppCVar4;
            bVar3 = CFGNode::dominates(pCVar2,other);
            if (bVar3) {
              for (; other != node; other = other->immediate_dominator) {
                bVar3 = query_reachability(this,other,node);
                if (bVar3) {
                  bVar5 = 1;
                  break;
                }
                bVar3 = query_reachability(this,node,other);
                if (bVar3) goto LAB_00130f06;
              }
            }
          }
          uVar6 = (uint)(bVar5 ^ 1);
        }
        goto LAB_00130f60;
      }
    }
  }
LAB_00130f06:
  uVar6 = 1;
LAB_00130f60:
  return SUB41(uVar6,0);
}

Assistant:

bool CFGStructurizer::control_flow_is_escaping(const CFGNode *node, const CFGNode *merge) const
{
	if (node == merge)
		return false;

	if (control_flow_is_escaping_from_loop(node, merge))
		return true;

	// Try to test if our block is load bearing, in which case it cannot be considered a break block.
	// If the only path from idom to merge goes through node, it must be considered load bearing,
	// since removing break paths must not change reachability.
	if (block_is_load_bearing(node, merge))
		return false;

	// If we have two different switch blocks in our PDF frontier something ridiculous is happening
	// where we effectively have one switch block falling through to another switch block (?!?!?!)
	// Definitely needs to be split up.
	unsigned switch_pdf_frontiers = 0;
	for (auto *frontier : node->post_dominance_frontier)
		if (frontier->ir.terminator.type == Terminator::Type::Switch)
			switch_pdf_frontiers++;

	if (switch_pdf_frontiers >= 2)
		return true;

	// If we cannot prove the escape through loop analysis, we might be able to deduce it from domination frontiers.
	// If control flow is not escaping, then there must exist a dominance frontier node A,
	// where merge strictly post-dominates A.
	// This means that control flow can merge somewhere before we hit the merge block, and we consider that
	// normal structured control flow.

	bool escaping_path = !node->reaches_domination_frontier_before_merge(merge);

	// This is a strong check.
	// If node directly branches to merge, but PDF does not,
	// we have detected a control flow pattern which is clearly a break.
	// The PDF candidate must dominate node for this check to be meaningful.
	if (escaping_path)
	{
		for (auto *frontier : node->post_dominance_frontier)
			if (frontier->dominates(node) && frontier->reaches_domination_frontier_before_merge(merge))
				return true;

		// Strong check as well.
		// If branching directly to continue block like this, this is a non-merging continue,
		// which we should always consider an escape.
		if (node->succ.size() == 1 && node->succ.front()->succ_back_edge)
			return true;
	}

	if (escaping_path && node->ir.operations.empty() && node->ir.phi.empty())
	{
		// If we post-dominate nothing useful or do nothing useful ourselves,
		// this is a good indication we're a common escape edge ladder block.
		// This can happen if we have a graph of:
		// A -> B
		// A -> C
		// B -> merge
		// C -> merge
		// B -> node
		// C -> node
		// node -> merge
		// This super jank diamond pattern will break the heuristics.
		if (!node->post_dominates_any_work())
			return true;
	}

	if (escaping_path && node->pred.size() >= 2)
	{
		// We also need to consider false positives here, which are mostly only relevant for merge candidates.

		// One case would be selection construct A, which terminates in block B. B then branches to C.
		// Earlier in the A -> B construct, there might be a break block D which also branches to B.
		// This means that C will be a "false" domination frontier of B and our analysis above is wrong.

		// The algorithm here:
		// - Get idom of node, which represents the header. For this analysis, we're only interested
		//   in code paths which are dominated by idom.
		// - Find all preds of merge which are dominated by idom(node).
		// - Backtrace every pred P until they can reach B, or B can reach P.
		// - If B has strictly lowest post-visit order, we are not escaping. P was.

		auto *idom = node->immediate_dominator;
		bool found_false_positive = false;

		for (auto *pred : merge->pred)
		{
			// Don't care about these.
			if (!idom->dominates(pred))
				continue;

			while (pred != node && !query_reachability(*pred, *node) && !query_reachability(*node, *pred))
				pred = pred->immediate_dominator;

			// Ignore these.
			if (pred == node)
				continue;

			if (query_reachability(*pred, *node))
			{
				// Seems good. Keep going. If we don't find a counter example, we'll accept this as a false positive.
				found_false_positive = true;
			}
			else
			{
				// Indeed, this is an escape.
				found_false_positive = false;
				break;
			}
		}

		escaping_path = !found_false_positive;
	}

	return escaping_path;
}